

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void FBehavior::StaticUnlockLevelVarStrings(void)

{
  long lVar1;
  ulong uVar2;
  
  if (StaticModules.Count != 0) {
    uVar2 = 0;
    do {
      UnlockMapVarStrings(StaticModules.Array[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < StaticModules.Count);
  }
  if (DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) {
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) == 0) {
      for (lVar1 = *(long *)((long)DACSThinker::ActiveThinker.field_0 + 0x58); lVar1 != 0;
          lVar1 = *(long *)(lVar1 + 0x28)) {
        ACSStringPool::UnlockStringArray
                  (&GlobalACSStrings,*(int **)(lVar1 + 0x40),*(uint *)(lVar1 + 0x4c));
      }
    }
    else {
      DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
    }
  }
  return;
}

Assistant:

void FBehavior::StaticUnlockLevelVarStrings()
{
	// Unlock map variables.
	for (DWORD modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		StaticModules[modnum]->UnlockMapVarStrings();
	}
	// Unlock running scripts' local variables.
	if (DACSThinker::ActiveThinker != NULL)
	{
		for (DLevelScript *script = DACSThinker::ActiveThinker->Scripts; script != NULL; script = script->GetNext())
		{
			script->UnlockLocalVarStrings();
		}
	}
}